

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O1

void ncnn::draw_text_c3(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uchar *resized_font_bitmap;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uchar *puVar14;
  byte *pbVar15;
  
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(fontpixelsize * fontpixelsize * 2));
  sVar6 = strlen(text);
  if (0 < (int)(uint)sVar6) {
    uVar9 = 0;
    uVar10 = x;
    do {
      cVar1 = text[uVar9];
      if (cVar1 == ' ') {
        uVar11 = uVar10 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + fontpixelsize * 2;
        uVar11 = x;
      }
      else {
        iVar4 = isprint((int)cVar1);
        uVar11 = uVar10;
        if (iVar4 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5f34c0),resized_font_bitmap,fontpixelsize);
          uVar5 = 0;
          if (0 < y) {
            uVar5 = y;
          }
          uVar13 = y + fontpixelsize * 2;
          if (h <= (int)uVar13) {
            uVar13 = h;
          }
          uVar7 = 0;
          if (0 < (int)uVar10) {
            uVar7 = uVar10;
          }
          uVar11 = uVar10 + fontpixelsize;
          uVar3 = w;
          if ((int)uVar11 < w) {
            uVar3 = uVar11;
          }
          if ((int)uVar5 < (int)uVar13) {
            uVar12 = (ulong)uVar5;
            puVar14 = resized_font_bitmap +
                      (((uVar12 - (long)y) * (long)fontpixelsize + (ulong)uVar7) - (long)(int)uVar10
                      );
            do {
              if ((int)uVar7 < (int)uVar3) {
                pbVar15 = pixels + uVar12 * (long)stride + (ulong)(uVar7 * 3);
                lVar8 = 0;
                do {
                  bVar2 = puVar14[lVar8];
                  uVar10 = bVar2 ^ 0xff;
                  *pbVar15 = (byte)((ulong)((color & 0xff) * (uint)bVar2 + *pbVar15 * uVar10) *
                                    0x1010102 >> 0x20);
                  pbVar15[1] = (byte)((ulong)((color >> 8 & 0xff) * (uint)bVar2 +
                                             pbVar15[1] * uVar10) * 0x1010102 >> 0x20);
                  pbVar15[2] = (byte)((ulong)((uint)bVar2 * (color >> 0x10 & 0xff) +
                                             pbVar15[2] * uVar10) * 0x1010102 >> 0x20);
                  pbVar15 = pbVar15 + 3;
                  lVar8 = lVar8 + 1;
                } while (uVar3 - uVar7 != (int)lVar8);
              }
              uVar12 = uVar12 + 1;
              puVar14 = puVar14 + fontpixelsize;
            } while (uVar12 != uVar13);
          }
        }
      }
      uVar10 = uVar11;
      uVar9 = uVar9 + 1;
    } while (uVar9 != ((uint)sVar6 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c3(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 3;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p[2] = (p[2] * (255 - alpha) + pen_color[2] * alpha) / 255;
                    p += 3;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}